

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateGLImpl::PipelineStateGLImpl
          (PipelineStateGLImpl *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDeviceGL,
          GraphicsPipelineStateCreateInfo *CreateInfo,bool bIsDeviceInternal)

{
  PSO_CREATE_FLAGS PVar1;
  IShader **ppShader;
  Char *Message;
  char (*Args_1) [96];
  undefined1 local_138 [8];
  string msg;
  undefined1 local_110 [4];
  PIPELINE_STATE_STATUS Status;
  DoublePtrHelper<Diligent::IShader> local_108;
  undefined1 local_f8 [8];
  ShaderCreateInfo ShaderCI;
  RefCntAutoPtr<Diligent::ShaderGLImpl> pTempPS;
  undefined1 local_48 [8];
  TShaderStages Shaders;
  bool bIsDeviceInternal_local;
  GraphicsPipelineStateCreateInfo *CreateInfo_local;
  RenderDeviceGLImpl *pDeviceGL_local;
  IReferenceCounters *pRefCounters_local;
  PipelineStateGLImpl *this_local;
  
  Shaders.super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = bIsDeviceInternal;
  PipelineStateBase<Diligent::EngineGLImplTraits>::
  PipelineStateBase<Diligent::GraphicsPipelineStateCreateInfo>
            (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,pRefCounters,pDeviceGL,
             CreateInfo,bIsDeviceInternal);
  (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
  .super_ObjectBase<Diligent::IPipelineStateGL>.super_RefCountedObject<Diligent::IPipelineStateGL>.
  super_IPipelineStateGL.super_IPipelineState.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_013a3998;
  this->m_GLPrograms = (SharedGLProgramPtr *)0x0;
  Threading::SpinLock::SpinLock(&this->m_ProgPipelineLock);
  std::
  vector<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
  ::vector(&this->m_GLProgPipelines);
  this->m_NumPrograms = '\0';
  this->m_IsProgramPipelineSupported = false;
  this->m_ShaderTypes = (SHADER_TYPE *)0x0;
  this->m_BaseBindings = (TBindings *)0x0;
  std::
  unique_ptr<Diligent::PipelineStateGLImpl::PipelineBuilderBase,std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>>
  ::unique_ptr<std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>,void>
            ((unique_ptr<Diligent::PipelineStateGLImpl::PipelineBuilderBase,std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>>
              *)&this->m_Builder);
  std::
  vector<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
  ::vector(&this->m_ShaderResources);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_ShaderNames);
  std::
  vector<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
  ::vector(&this->m_ResourceAttibutions);
  std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::vector
            ((vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> *)local_48
            );
  PipelineStateBase<Diligent::EngineGLImplTraits>::
  ExtractShaders<Diligent::ShaderGLImpl,Diligent::GraphicsPipelineStateCreateInfo,std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>>
            (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,CreateInfo,
             (vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> *)local_48
             ,false);
  RefCntAutoPtr<Diligent::ShaderGLImpl>::RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::ShaderGLImpl> *)&ShaderCI.WebGPUEmulatedArrayIndexSuffix);
  if (CreateInfo->pPS == (IShader *)0x0) {
    ShaderCreateInfo::ShaderCreateInfo((ShaderCreateInfo *)local_f8);
    ShaderCI.Desc.CombinedSamplerSuffix._0_4_ = 2;
    ShaderCI.pShaderSourceStreamFactory = (IShaderSourceInputStreamFactory *)anon_var_dwarf_5d66be;
    ShaderCI.Desc.super_DeviceObjectAttribs.Name._0_4_ = 2;
    ShaderCI.Macros._8_8_ = anon_var_dwarf_5d66ca;
    RefCntAutoPtr<Diligent::ShaderGLImpl>::DblPtr<Diligent::IShader,void>
              ((RefCntAutoPtr<Diligent::ShaderGLImpl> *)&local_108);
    ppShader = Diligent::RefCntAutoPtr::DoublePtrHelper::operator_cast_to_IShader__
                         ((DoublePtrHelper *)&local_108);
    RenderDeviceGLImpl::CreateShader
              (pDeviceGL,(ShaderCreateInfo *)local_f8,ppShader,(IDataBlob **)0x0);
    RefCntAutoPtr<Diligent::ShaderGLImpl>::DoublePtrHelper<Diligent::IShader>::~DoublePtrHelper
              (&local_108);
    std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>::
    emplace_back<Diligent::RefCntAutoPtr<Diligent::ShaderGLImpl>&>
              ((vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>> *)local_48,
               (RefCntAutoPtr<Diligent::ShaderGLImpl> *)&ShaderCI.WebGPUEmulatedArrayIndexSuffix);
  }
  Args_1 = (char (*) [96])local_48;
  std::
  make_unique<Diligent::PipelineStateGLImpl::PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,Diligent::GraphicsPipelineStateCreateInfoX>,Diligent::PipelineStateGLImpl&,Diligent::GraphicsPipelineStateCreateInfo_const&,std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>>
            ((PipelineStateGLImpl *)local_110,(GraphicsPipelineStateCreateInfo *)this,
             (vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> *)
             CreateInfo);
  std::
  unique_ptr<Diligent::PipelineStateGLImpl::PipelineBuilderBase,std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>>
  ::operator=((unique_ptr<Diligent::PipelineStateGLImpl::PipelineBuilderBase,std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>>
               *)&this->m_Builder,
              (unique_ptr<Diligent::PipelineStateGLImpl::PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>_>_>
               *)local_110);
  std::
  unique_ptr<Diligent::PipelineStateGLImpl::PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>_>_>
  ::~unique_ptr((unique_ptr<Diligent::PipelineStateGLImpl::PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>_>_>
                 *)local_110);
  PVar1 = Diligent::operator&((CreateInfo->super_PipelineStateCreateInfo).Flags,
                              PSO_CREATE_FLAG_ASYNCHRONOUS);
  msg.field_2._12_4_ = GetStatus(this,PVar1 == PSO_CREATE_FLAG_NONE);
  if (msg.field_2._12_4_ != PIPELINE_STATE_STATUS_READY) {
    PVar1 = Diligent::operator&((CreateInfo->super_PipelineStateCreateInfo).Flags,
                                PSO_CREATE_FLAG_ASYNCHRONOUS);
    if (PVar1 == PSO_CREATE_FLAG_NONE) {
      FormatString<char[26],char[96]>
                ((string *)local_138,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "Status == PIPELINE_STATE_STATUS_READY || (CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0"
                 ,Args_1);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"PipelineStateGLImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                 ,0x20a);
      std::__cxx11::string::~string((string *)local_138);
    }
  }
  RefCntAutoPtr<Diligent::ShaderGLImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::ShaderGLImpl> *)&ShaderCI.WebGPUEmulatedArrayIndexSuffix);
  std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::~vector
            ((vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> *)local_48
            );
  return;
}

Assistant:

PipelineStateGLImpl::PipelineStateGLImpl(IReferenceCounters*                    pRefCounters,
                                         RenderDeviceGLImpl*                    pDeviceGL,
                                         const GraphicsPipelineStateCreateInfo& CreateInfo,
                                         bool                                   bIsDeviceInternal) :
    // clang-format off
    TPipelineStateBase
    {
        pRefCounters,
        pDeviceGL,
        CreateInfo,
        bIsDeviceInternal
    }
// clang-format on
{
    try
    {
        TShaderStages Shaders;
        ExtractShaders<ShaderGLImpl>(CreateInfo, Shaders);

        RefCntAutoPtr<ShaderGLImpl> pTempPS;
        if (CreateInfo.pPS == nullptr)
        {
            // Some OpenGL implementations fail if fragment shader is not present, so
            // create a dummy one.
            ShaderCreateInfo ShaderCI;
            ShaderCI.SourceLanguage  = SHADER_SOURCE_LANGUAGE_GLSL;
            ShaderCI.Source          = "void main(){}";
            ShaderCI.Desc.ShaderType = SHADER_TYPE_PIXEL;
            ShaderCI.Desc.Name       = "Dummy fragment shader";
            pDeviceGL->CreateShader(ShaderCI, pTempPS.DblPtr<IShader>(), nullptr);

            Shaders.emplace_back(pTempPS);
        }

        m_Builder = std::make_unique<PipelineBuilder<GraphicsPipelineStateCreateInfo, GraphicsPipelineStateCreateInfoX>>(*this, CreateInfo, std::move(Shaders));

        // Force builder tick
        PIPELINE_STATE_STATUS Status = GetStatus(/*WaitForCompletion = */ (CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) == 0);
        VERIFY_EXPR(Status == PIPELINE_STATE_STATUS_READY || (CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0);
    }
    catch (...)
    {
        Destruct();
        throw;
    }
}